

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall
t_rs_generator::render_union_impl(t_rs_generator *this,string *union_name,t_struct *tstruct)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  ostream *poVar3;
  
  poVar1 = &this->f_gen_;
  poVar3 = std::operator<<((ostream *)poVar1,"impl ");
  poVar3 = std::operator<<(poVar3,(string *)union_name);
  poVar3 = std::operator<<(poVar3," {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  render_union_sync_read(this,union_name,tstruct);
  render_union_sync_write(this,union_name,tstruct);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  poVar3 = std::operator<<((ostream *)poVar1,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rs_generator::render_union_impl(const string& union_name, t_struct* tstruct) {
  f_gen_ << "impl " << union_name << " {" << endl;
  indent_up();

  render_union_sync_read(union_name, tstruct);
  render_union_sync_write(union_name, tstruct);

  indent_down();
  f_gen_ << "}" << endl;
  f_gen_ << endl;
}